

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Outlining.cpp
# Opt level: O0

void __thiscall
wasm::ReconstructStringifyWalker::startExistingFunction
          (ReconstructStringifyWalker *this,Function *func)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  Fatal local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_210;
  Err *err_1;
  Result<wasm::Ok> _val_1;
  Err *err;
  Result<wasm::Expression_*> _val;
  Function *func_local;
  ReconstructStringifyWalker *this_local;
  
  _val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
  super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
  super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
  super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
  super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_ = func;
  IRBuilder::build((Result<wasm::Expression_*> *)&err,&this->existingBuilder);
  arg = &Result<wasm::Expression_*>::getErr((Result<wasm::Expression_*> *)&err)->msg;
  if (arg != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    Fatal::Fatal((Fatal *)((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    Fatal::operator<<((Fatal *)((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),arg);
    Fatal::~Fatal((Fatal *)((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  }
  Result<wasm::Expression_*>::~Result((Result<wasm::Expression_*> *)&err);
  IRBuilder::visitFunctionStart
            ((Result<wasm::Ok> *)&err_1,&this->existingBuilder,
             (Function *)
             _val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
             super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_);
  local_210 = &Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_1)->msg;
  if (local_210 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    Fatal::Fatal(&local_398);
    Fatal::operator<<(&local_398,local_210);
    Fatal::~Fatal(&local_398);
  }
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_1);
  this->instrCounter = 0;
  this->seqCounter = 0;
  this->state = NotInSeq;
  return;
}

Assistant:

void startExistingFunction(Function* func) {
    ASSERT_OK(existingBuilder.build());
    ASSERT_OK(existingBuilder.visitFunctionStart(func));
    instrCounter = 0;
    seqCounter = 0;
    state = NotInSeq;
    ODBG(std::cerr << "\n"
                   << "Func Start to $" << func->name << " at "
                   << &existingBuilder << "\n");
  }